

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall
amrex::DeriveList::add
          (DeriveList *this,string *name,IndexType result_type,int nvar_der,DeriveBoxMap box_map)

{
  DeriveRec local_b0;
  
  DeriveRec::DeriveRec(&local_b0,name,result_type,nvar_der,box_map);
  std::__cxx11::list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>::push_back
            (&this->lst,&local_b0);
  DeriveRec::~DeriveRec(&local_b0);
  return;
}

Assistant:

void
DeriveList::add (const std::string&      name,
                 IndexType               result_type,
                 int                     nvar_der,
                 DeriveRec::DeriveBoxMap box_map)
{
    lst.push_back(DeriveRec(name,result_type,nvar_der,box_map));
}